

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.c
# Opt level: O0

Raw ResizeObject(Heap *heap,Raw object,Size userSize)

{
  uint8_t uVar1;
  Chuck *chuck_00;
  ulong uVar2;
  Size SVar3;
  Chuck *pCVar4;
  Size SVar5;
  Raw copied;
  Size size;
  Chuck *chuck;
  Size userSize_local;
  Raw object_local;
  Heap *heap_local;
  
  chuck_00 = ToChuck(object);
  uVar2 = userSize + 0xb & 0xfffffffffffffff8;
  SVar3 = GetSize(chuck_00);
  heap_local = (Heap *)object;
  if (SVar3 < uVar2) {
    pCVar4 = GetHigher(chuck_00);
    uVar1 = GetUsed(pCVar4);
    if (uVar1 == '\0') {
      SVar3 = GetSize(chuck_00);
      pCVar4 = GetHigher(chuck_00);
      SVar5 = GetSize(pCVar4);
      if (uVar2 <= SVar3 + SVar5) {
        pCVar4 = GetHigher(chuck_00);
        SVar3 = GetSize(chuck_00);
        AllocateInChuck(heap,pCVar4,uVar2 - SVar3);
        pCVar4 = GetHigher(chuck_00);
        pCVar4 = GetHigher(pCVar4);
        SetHigher(chuck_00,pCVar4);
        return object;
      }
    }
    heap_local = (Heap *)AllocateObject(heap,userSize);
    if (heap_local == (Heap *)0x0) {
      heap_local = (Heap *)0x0;
    }
    else {
      SVar3 = GetSize(chuck_00);
      memcpy(heap_local,object,SVar3 - 4);
      ReleaseObject(heap,object);
    }
  }
  return heap_local;
}

Assistant:

Raw ResizeObject(Heap *heap, Raw object, Size userSize) {
    Chuck *chuck = ToChuck(object);
    Size size = (userSize + OVERHEAD_OF_USED_CHUCK + 0x07) >> 3u << 3u;
    if (size <= GetSize(chuck)) {
        return object;
    }
    if (!GetUsed(GetHigher(chuck)) &&
        size <= GetSize(chuck) + GetSize(GetHigher(chuck))) {
        AllocateInChuck(heap, GetHigher(chuck), size - GetSize(chuck));
        SetHigher(chuck, GetHigher(GetHigher(chuck)));
        return object;
    }
    Raw copied = AllocateObject(heap, userSize);
    if (!copied) {
        return NULL;
    }
    memcpy(copied, object, GetSize(chuck) - OVERHEAD_OF_USED_CHUCK);
    ReleaseObject(heap, object);
    return copied;
}